

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<const_kj::File>_> __thiscall
kj::anon_unknown_8::DiskDirectory::tryOpenFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  undefined4 in_register_0000000c;
  File *extraout_RDX;
  WriteMode in_R8D;
  Maybe<kj::Own<const_kj::File>_> MVar1;
  PathPtr path_00;
  NullableValue<kj::AutoCloseFd> local_34;
  Own<kj::File> local_28;
  
  path_00.parts.size_._4_4_ = in_register_0000000c;
  path_00.parts.size_._0_4_ = mode;
  path_00.parts.ptr = (String *)path.parts.size_;
  DiskHandle::tryOpenFileInternal
            ((Maybe<kj::AutoCloseFd> *)&local_34,(DiskHandle *)&((path.parts.ptr)->content).size_,
             path_00,in_R8D,false);
  Maybe<kj::AutoCloseFd>::map<kj::Own<kj::File>_(&)(kj::AutoCloseFd)>
            ((Maybe<kj::AutoCloseFd> *)&local_28,(_func_Own<kj::File>_AutoCloseFd *)&local_34);
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)local_28.disposer;
  (this->super_DiskHandle).fd = (AutoCloseFd)local_28.ptr;
  local_28.ptr = (File *)0x0;
  Own<kj::File>::dispose(&local_28);
  kj::_::NullableValue<kj::AutoCloseFd>::~NullableValue(&local_34);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenFile(path, mode);
  }